

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O1

MPP_RET copy2osd2(MppEncOSDData2 *dst,MppEncOSDData *src1,MppEncOSDData2 *src2)

{
  uint uVar1;
  MppBuffer pvVar2;
  RK_U32 *pRVar3;
  long lVar4;
  
  if (src1 == (MppEncOSDData *)0x0) {
    if (src2 == (MppEncOSDData2 *)0x0) {
      return MPP_NOK;
    }
    memcpy(dst,src2,0x148);
  }
  else {
    uVar1 = src1->num_region;
    dst->num_region = uVar1;
    if ((ulong)uVar1 != 0) {
      pvVar2 = src1->buf;
      pRVar3 = &src1->region[0].buf_offset;
      lVar4 = 0;
      do {
        *(RK_U32 *)((long)&dst->region[0].enable + lVar4) =
             ((MppEncOSDRegion *)(pRVar3 + -6))->enable;
        *(RK_U32 *)((long)&dst->region[0].inverse + lVar4) = pRVar3[-5];
        *(RK_U32 *)((long)&dst->region[0].start_mb_x + lVar4) = pRVar3[-4];
        *(RK_U32 *)((long)&dst->region[0].start_mb_y + lVar4) = pRVar3[-3];
        *(RK_U32 *)((long)&dst->region[0].num_mb_x + lVar4) = pRVar3[-2];
        *(RK_U32 *)((long)&dst->region[0].num_mb_y + lVar4) = pRVar3[-1];
        *(RK_U32 *)((long)&dst->region[0].buf_offset + lVar4) = *pRVar3;
        *(MppBuffer *)((long)&dst->region[0].buf + lVar4) = pvVar2;
        pRVar3 = pRVar3 + 7;
        lVar4 = lVar4 + 0x28;
      } while ((ulong)uVar1 * 0x28 != lVar4);
      return MPP_OK;
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET copy2osd2(MppEncOSDData2* dst, MppEncOSDData *src1, MppEncOSDData2 *src2)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i = 0;

    if (src1) {
        dst->num_region = src1->num_region;
        for (i = 0; i < src1->num_region; i++) {
            dst->region[i].enable       = src1->region[i].enable;
            dst->region[i].inverse      = src1->region[i].inverse;
            dst->region[i].start_mb_x   = src1->region[i].start_mb_x;
            dst->region[i].start_mb_y   = src1->region[i].start_mb_y;
            dst->region[i].num_mb_x     = src1->region[i].num_mb_x;
            dst->region[i].num_mb_y     = src1->region[i].num_mb_y;
            dst->region[i].buf_offset   = src1->region[i].buf_offset;
            dst->region[i].buf          = src1->buf;
        }
        ret = MPP_OK;
    } else if (src2) {
        memcpy(dst, src2, sizeof(MppEncOSDData2));
        ret = MPP_OK;
    } else {
        ret = MPP_NOK;
    }
    return ret;
}